

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O3

void __thiscall
GeneratorProfile_defaultGeneralValues_Test::TestBody
          (GeneratorProfile_defaultGeneralValues_Test *this)

{
  char cVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  GeneratorProfilePtr generatorProfile;
  Profile local_50 [2];
  Profile local_48;
  undefined4 uStack_44;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::GeneratorProfile::create((Profile)local_18);
  local_48 = C;
  local_50[0] = libcellml::GeneratorProfile::profile();
  testing::internal::
  CmpHelperEQ<libcellml::GeneratorProfile::Profile,libcellml::GeneratorProfile::Profile>
            ((internal *)&local_38,"libcellml::GeneratorProfile::Profile::C",
             "generatorProfile->profile()",&local_48,local_50);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    if (CONCAT44(uStack_44,local_48) != 0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)CONCAT44(uStack_44,local_48) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(uStack_44,local_48) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::profile();
  libcellml::GeneratorProfile::profileAsString_abi_cxx11_((Profile)&local_38);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_48,"\"c\"",
             "libcellml::GeneratorProfile::profileAsString(generatorProfile->profile())",
             (char (*) [2])0x166a5b,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  if ((Message)(undefined1)local_48 == (Message)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') &&
         ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                       (char)local_38._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = CONCAT31(local_48._1_3_,1);
  uVar2 = libcellml::GeneratorProfile::hasInterface();
  local_50[0] = CONCAT31(local_50[0]._1_3_,uVar2);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"true","generatorProfile->hasInterface()",(bool *)&local_48,
             (bool *)local_50);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    if (CONCAT44(uStack_44,local_48) != 0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)CONCAT44(uStack_44,local_48) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(uStack_44,local_48) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(GeneratorProfile, defaultGeneralValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ(libcellml::GeneratorProfile::Profile::C, generatorProfile->profile());
    EXPECT_EQ("c", libcellml::GeneratorProfile::profileAsString(generatorProfile->profile()));

    EXPECT_EQ(true, generatorProfile->hasInterface());
}